

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteFoldedExprList(WatWriter *this,ExprList *exprs)

{
  undefined8 *puVar1;
  Index IVar2;
  pointer pEVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  pointer *this_00;
  Expr *expr;
  ulong uVar7;
  Index IVar8;
  pointer pEVar9;
  long lVar10;
  long lVar11;
  pointer pEVar12;
  ExprTree *__args;
  Arities AVar13;
  ExprTree tree;
  ExprTree local_70;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_48;
  
  expr = exprs->first_;
  if (expr != (Expr *)0x0) {
    do {
      AVar13 = ModuleContext::GetExprArity(&this->super_ModuleContext,expr);
      uVar4 = AVar13.nargs;
      IVar8 = AVar13.nreturns;
      if (uVar4 != 0) {
        pEVar3 = (this->expr_tree_stack_).
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar10 = 0;
        uVar7 = 0x28;
        lVar11 = -0x20;
        uVar5 = 0;
LAB_00142172:
        pEVar12 = (pointer)((long)&pEVar3->expr + lVar10);
        if (pEVar12 !=
            (this->expr_tree_stack_).
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          IVar2 = pEVar12[-1].result_count;
          if (IVar2 == 0) {
            __assert_fail("iter->result_count > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wat-writer.cc"
                          ,0x473,
                          "void wabt::(anonymous namespace)::WatWriter::PushExpr(const Expr *, Index, Index)"
                         );
          }
          uVar5 = uVar5 + IVar2;
          if (uVar5 != uVar4) goto code_r0x00142190;
          local_70.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_70.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_70.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_70.expr = expr;
          local_70.result_count = IVar8;
          if (0 < (long)uVar7) {
            __args = (ExprTree *)((long)pEVar3 - uVar7);
            uVar6 = uVar7 / 0x28 + 1;
            do {
              std::
              vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ::emplace_back<wabt::(anonymous_namespace)::ExprTree>(&local_70.children,__args);
              __args = __args + 1;
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
          }
          pEVar12 = (this->expr_tree_stack_).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar6 = (long)pEVar12 - (long)pEVar3;
          pEVar9 = pEVar3;
          if ((uVar6 != 0) && (pEVar9 = pEVar12, 0 < (long)uVar6)) {
            uVar6 = uVar6 / 0x28 + 1;
            do {
              *(Expr **)((long)&pEVar3[-1].expr + lVar10) = pEVar3->expr;
              local_48.
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)((long)pEVar3 + lVar10 + -0x10);
              pEVar12 = (pEVar3->children).
                        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              puVar1 = (undefined8 *)((long)pEVar3 + lVar10 + -0x20);
              local_48.
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
              local_48.
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
              puVar1 = (undefined8 *)((long)pEVar3 + lVar10 + -0x20);
              *puVar1 = (pEVar3->children).
                        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1[1] = pEVar12;
              *(pointer *)((long)pEVar3 + lVar10 + -0x10) =
                   (pEVar3->children).
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (pEVar3->children).
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pEVar3->children).
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (pEVar3->children).
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ::~vector(&local_48);
              *(Index *)((long)pEVar3 + lVar10 + -8) = pEVar3->result_count;
              pEVar3 = pEVar3 + 1;
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
            pEVar9 = (this->expr_tree_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          pEVar3 = (pointer)((long)pEVar9 - uVar7);
          uVar5 = uVar4;
          if (pEVar3 != pEVar9) {
            this_00 = (pointer *)((long)&pEVar9->expr + lVar11);
            pEVar12 = pEVar3;
            do {
              std::
              vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ::~vector((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                         *)this_00);
              pEVar12 = pEVar12 + 1;
              this_00 = this_00 + 5;
            } while (pEVar12 != pEVar9);
            (this->expr_tree_stack_).
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ._M_impl.super__Vector_impl_data._M_finish = pEVar3;
          }
          goto LAB_001421dd;
        }
        goto LAB_001421da;
      }
      uVar5 = 0;
LAB_001421da:
      local_70.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_70.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_70.expr = expr;
      local_70.result_count = IVar8;
LAB_001421dd:
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::emplace_back<wabt::(anonymous_namespace)::ExprTree>(&this->expr_tree_stack_,&local_70);
      if ((AVar13._0_8_ >> 0x20 == 0) || (uVar4 < uVar5)) {
        FlushExprTreeStack(this);
      }
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::~vector(&local_70.children);
      expr = (expr->super_intrusive_list_base<wabt::Expr>).next_;
    } while (expr != (Expr *)0x0);
  }
  return;
code_r0x00142190:
  uVar7 = uVar7 + 0x28;
  lVar10 = lVar10 + -0x28;
  lVar11 = lVar11 + -0x28;
  if (uVar4 < uVar5) goto LAB_001421da;
  goto LAB_00142172;
}

Assistant:

void WatWriter::WriteFoldedExprList(const ExprList& exprs) {
  WABT_TRACE(WriteFoldedExprList);
  for (const Expr& expr : exprs) {
    WriteFoldedExpr(&expr);
  }
}